

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

bdecode_node * __thiscall
libtorrent::torrent_info::info(bdecode_node *__return_storage_ptr__,torrent_info *this,char *key)

{
  bdecode_node *this_00;
  char *start;
  type_t tVar1;
  size_t sVar2;
  string_view key_00;
  error_code ec;
  error_code local_38;
  
  this_00 = &this->m_info_dict;
  tVar1 = bdecode_node::type(this_00);
  if (tVar1 == none_t) {
    local_38.val_ = 0;
    local_38.failed_ = false;
    local_38.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    start = (this->m_info_section).px;
    bdecode(start,start + this->m_info_section_size,this_00,&local_38,(int *)0x0,100,2000000);
    if (local_38.failed_ == true) {
      __return_storage_ptr__->m_last_index = 0;
      __return_storage_ptr__->m_last_token = 0;
      __return_storage_ptr__->m_size = 0;
      *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
      __return_storage_ptr__->m_buffer = (char *)0x0;
      __return_storage_ptr__->m_buffer_size = 0;
      __return_storage_ptr__->m_token_idx = 0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->m_tokens).
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->m_token_idx = -1;
      __return_storage_ptr__->m_last_index = -1;
      __return_storage_ptr__->m_last_token = -1;
      __return_storage_ptr__->m_size = -1;
      return __return_storage_ptr__;
    }
  }
  sVar2 = strlen(key);
  key_00._M_str = key;
  key_00._M_len = sVar2;
  bdecode_node::dict_find(__return_storage_ptr__,this_00,key_00);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node torrent_info::info(char const* key) const
	{
		if (m_info_dict.type() == bdecode_node::none_t)
		{
			error_code ec;
			bdecode(m_info_section.get(), m_info_section.get()
				+ m_info_section_size, m_info_dict, ec);
			if (ec) return bdecode_node();
		}
		return m_info_dict.dict_find(key);
	}